

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O2

ostream * wasm::WATParser::operator<<(ostream *os,FloatTok *tok)

{
  double dVar1;
  ostream *poVar2;
  char *pcVar3;
  
  dVar1 = tok->d;
  if (!NAN(dVar1)) {
    poVar2 = std::ostream::_M_insert<double>(dVar1);
    return poVar2;
  }
  pcVar3 = "-";
  if ((long)dVar1 < 0) {
    pcVar3 = "+";
  }
  std::operator<<(os,pcVar3);
  if ((tok->nanPayload).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    poVar2 = std::operator<<(os,"nan:0x");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    return poVar2;
  }
  poVar2 = std::operator<<(os,"nan");
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const FloatTok& tok) {
  if (std::isnan(tok.d)) {
    os << (std::signbit(tok.d) ? "+" : "-");
    if (tok.nanPayload) {
      return os << "nan:0x" << std::hex << *tok.nanPayload << std::dec;
    }
    return os << "nan";
  }
  return os << tok.d;
}